

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O0

bool __thiscall testing::Test::Check(Test *this,bool condition,char *file,int line,char *error)

{
  string local_50;
  char *local_30;
  char *error_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  Test *pTStack_10;
  bool condition_local;
  Test *this_local;
  
  file_local._7_1_ = condition;
  if (!condition) {
    local_30 = error;
    error_local._4_4_ = line;
    pcStack_20 = file;
    pTStack_10 = this;
    (anonymous_namespace)::StringPrintf_abi_cxx11_
              (&local_50,"*** Failure in %s:%d\n%s\n",file,(ulong)(uint)line,error);
    LinePrinter::PrintOnNewLine(&printer,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this->failed_ = true;
  }
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool testing::Test::Check(bool condition, const char* file, int line,
                          const char* error) {
  if (!condition) {
    printer.PrintOnNewLine(
        StringPrintf("*** Failure in %s:%d\n%s\n", file, line, error));
    failed_ = true;
  }
  return condition;
}